

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyTinySVD_3x3<double>(Matrix33<double> *A)

{
  long lVar1;
  Matrix33 **ppMVar2;
  double *pdVar3;
  double dVar4;
  uint __line;
  int i;
  long lVar5;
  Matrix33 *pMVar6;
  double (*padVar7) [3];
  int j;
  long lVar8;
  int iVar9;
  int j_1;
  char *__assertion;
  double dVar10;
  Matrix33 *local_178;
  Vec3<double> S;
  Matrix33<double> U;
  Matrix33<double> S_times_Vt;
  Matrix33<double> V;
  Matrix33<double> product;
  
  dVar10 = 0.0;
  padVar7 = (double (*) [3])A;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      dVar4 = ABS((*(double (*) [3])*padVar7)[lVar8]);
      if (dVar4 <= dVar10) {
        dVar4 = dVar10;
      }
      dVar10 = dVar4;
    }
    padVar7 = padVar7 + 1;
  }
  iVar9 = 0;
  local_178 = (Matrix33 *)A;
  while( true ) {
    if (iVar9 == 2) {
      return;
    }
    U.x[0][0] = 1.0;
    U.x[0][1] = 0.0;
    U.x[0][2] = 0.0;
    U.x[1][0] = 0.0;
    U.x[1][1] = 1.0;
    U.x[1][2] = 0.0;
    U.x[2][0] = 0.0;
    U.x[2][1] = 0.0;
    V.x[0][0] = 1.0;
    V.x[1][0] = 0.0;
    U.x[2][2] = 1.0;
    V.x[0][1] = 0.0;
    V.x[0][2] = 0.0;
    V.x[1][1] = 1.0;
    V.x[1][2] = 0.0;
    V.x[2][0] = 0.0;
    V.x[2][1] = 0.0;
    V.x[2][2] = 1.0;
    Imath_3_2::jacobiSVD<double>
              (local_178,(Matrix33 *)&U,(Vec3 *)&S,(Matrix33 *)&V,2.220446049250313e-16,iVar9 == 0);
    S_times_Vt.x[0][0] = 1.0;
    S_times_Vt.x[0][1] = 0.0;
    S_times_Vt.x[0][2] = 0.0;
    S_times_Vt.x[1][0] = 0.0;
    S_times_Vt.x[1][1] = 1.0;
    S_times_Vt.x[1][2] = 0.0;
    S_times_Vt.x[2][0] = 0.0;
    S_times_Vt.x[2][1] = 0.0;
    S_times_Vt.x[2][2] = 1.0;
    padVar7 = (double (*) [3])&S_times_Vt;
    pMVar6 = (Matrix33 *)&V;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        (*(double (*) [3])*padVar7)[lVar8] = (&S.x)[lVar8] * *(double *)(pMVar6 + lVar8 * 8);
      }
      padVar7 = padVar7 + 1;
      pMVar6 = pMVar6 + 0x18;
    }
    Imath_3_2::Matrix33<double>::transpose(&S_times_Vt);
    padVar7 = (double (*) [3])&product;
    Imath_3_2::Matrix33<double>::operator*(&U,&S_times_Vt);
    pMVar6 = local_178;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      lVar8 = 0;
      while (lVar8 != 3) {
        pdVar3 = *(double (*) [3])*padVar7 + lVar8;
        lVar1 = lVar8 * 8;
        lVar8 = lVar8 + 1;
        if (dVar10 * 10.0 * 2.220446049250313e-16 < ABS(*pdVar3 - *(double *)(pMVar6 + lVar1))) {
          __assertion = "std::abs (product[i][j] - A[i][j]) <= valueEps";
          __line = 0x55;
          goto LAB_001492aa;
        }
      }
      pMVar6 = pMVar6 + 0x18;
      padVar7 = padVar7 + 1;
    }
    if (iVar9 == 0) {
      dVar4 = Imath_3_2::Matrix33<double>::determinant(&U);
      if (dVar4 <= 0.9) {
        __assertion = "U.determinant () > 0.9";
        __line = 0x5a;
        goto LAB_001492aa;
      }
      dVar4 = Imath_3_2::Matrix33<double>::determinant(&V);
      if (dVar4 <= 0.9) {
        __assertion = "V.determinant () > 0.9";
        __line = 0x5b;
        goto LAB_001492aa;
      }
    }
    lVar5 = 1;
    while (lVar5 != 3) {
      ppMVar2 = &local_178 + lVar5;
      pdVar3 = &S.x + lVar5;
      lVar5 = lVar5 + 1;
      if ((double)*ppMVar2 < *pdVar3) {
        __assertion = "S[i] >= S[i + 1]";
        __line = 0x60;
        goto LAB_001492aa;
      }
    }
    if ((S.x < 0.0) || (S.y < 0.0)) break;
    if ((iVar9 != 0) && (S.z < 0.0)) {
      __assertion = "S[2] >= T (0)";
      __line = 0x66;
      goto LAB_001492aa;
    }
    verifyOrthonormal<double>(&U);
    verifyOrthonormal<double>(&V);
    iVar9 = iVar9 + 1;
  }
  __assertion = "S[i] >= T (0)";
  __line = 100;
LAB_001492aa:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,__line,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
}

Assistant:

void
verifyTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (10) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec3<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix33<T> product = U * S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V are orthogonal:
        if (posDet)
        {
            assert (U.determinant () > 0.9);
            assert (V.determinant () > 0.9);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[2] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}